

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

vector<TCacheReq,_std::allocator<TCacheReq>_> *
RandomAssignment(vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar5;
  TCacheReq local_1448;
  _Node_iterator_base<unsigned_long,_false> local_1438;
  undefined1 local_1430;
  _Node_iterator_base<unsigned_long,_false> local_1428;
  _Node_iterator_base<unsigned_long,_false> local_1420 [3];
  result_type local_1408;
  result_type videoId;
  size_t capacity;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  selected;
  size_t i;
  undefined1 local_13b0 [8];
  uniform_int_distribution<unsigned_long> randomVideo;
  mt19937 rng;
  TProblem *p_local;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&randomVideo._M_param._M_b);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&p->Vides);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_13b0,0,sVar2 - 1);
  std::vector<TCacheReq,_std::allocator<TCacheReq>_>::vector(__return_storage_ptr__);
  selected._M_h._M_single_bucket = (__node_base_ptr)0x0;
  do {
    if ((__node_base_ptr)p->CacheCount <= selected._M_h._M_single_bucket) {
      return __return_storage_ptr__;
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&capacity);
    videoId = p->CacheSize;
    while( true ) {
      sVar3 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&capacity);
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&p->Vides);
      if (sVar3 == sVar2) break;
      local_1408 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)local_13b0,
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)&randomVideo._M_param._M_b);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&p->Vides,local_1408);
      if (videoId < *pvVar4) break;
      local_1420[0]._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&capacity,&local_1408);
      local_1428._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)&capacity);
      bVar1 = std::__detail::operator!=(local_1420,&local_1428);
      if (!bVar1) {
        pVar5 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&capacity,&local_1408);
        local_1438._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
        local_1430 = pVar5.second;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&p->Vides,local_1408);
        videoId = videoId - *pvVar4;
        local_1448.ServerId = (size_t)selected._M_h._M_single_bucket;
        local_1448.VideoId = local_1408;
        std::vector<TCacheReq,_std::allocator<TCacheReq>_>::emplace_back<TCacheReq>
                  (__return_storage_ptr__,&local_1448);
      }
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&capacity);
    selected._M_h._M_single_bucket =
         (__node_base_ptr)((long)&(selected._M_h._M_single_bucket)->_M_nxt + 1);
  } while( true );
}

Assistant:

std::vector<TCacheReq> RandomAssignment(const TProblem& p) {
    std::mt19937 rng;
    std::uniform_int_distribution<size_t> randomVideo(0, p.Vides.size() - 1);

    std::vector<TCacheReq> reqs;

    for (size_t i = 0; i < p.CacheCount; ++i) {
        std::unordered_set<size_t> selected;

        size_t capacity = p.CacheSize;
        while (true) {
            if (selected.size() == p.Vides.size()) {
                break;
            }

            auto videoId = randomVideo(rng);
            if (p.Vides[videoId] > capacity) {
                break;
            }

            if (selected.find(videoId) != selected.end()) {
                continue;
            }

            selected.insert(videoId);
            capacity -= p.Vides[videoId];

            reqs.emplace_back(TCacheReq{i, videoId});
        }
    }

    return reqs;
}